

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamWriterPrivate::~QXmlStreamWriterPrivate(QXmlStreamWriterPrivate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Tag *__ptr;
  Data *pDVar3;
  NamespaceDeclaration *__ptr_00;
  
  if (((this->field_0x78 & 1) != 0) && (this->device != (QIODevice *)0x0)) {
    (*(this->device->super_QObject)._vptr_QObject[4])();
  }
  pcVar2 = (this->autoFormattingIndent)._M_dataplus._M_p;
  paVar1 = &(this->autoFormattingIndent).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  __ptr = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  if (__ptr != (Tag *)0x0) {
    free(__ptr);
  }
  pDVar3 = (this->super_QXmlStreamPrivateTagStack).tagStackStringStorage.d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate
                (&((this->super_QXmlStreamPrivateTagStack).tagStackStringStorage.d.d)->
                  super_QArrayData,2,0x10);
    }
  }
  __ptr_00 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
  if (__ptr_00 != (NamespaceDeclaration *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

~QXmlStreamWriterPrivate() {
        if (deleteDevice)
            delete device;
    }